

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O3

string * google::protobuf::TestTempDir_abi_cxx11_(void)

{
  Nonnull<char_*> buffer;
  __pid_t i;
  int iVar1;
  int *piVar2;
  AlphaNum *name;
  string *in_RDI;
  AlphaNum *in_R8;
  string_view contents;
  long *local_f0;
  long local_e0 [2];
  undefined1 local_d0 [48];
  AlphaNum *local_a0;
  Nonnull<std::unique_ptr<LogMessageData>_> local_98;
  string local_70;
  AlphaNum local_50;
  
  if (DAT_019a6d58 == (AlphaNum *)0x0) {
    i = getpid();
    testing::TempDir_abi_cxx11_();
    local_50.piece_._M_len = (size_t)&DAT_00000011;
    local_50.piece_._M_str = "protobuf_tempdir.";
    buffer = local_d0 + 0x10;
    local_d0._0_8_ = absl::lts_20250127::numbers_internal::FastIntToBuffer(i,buffer);
    local_d0._0_8_ = local_d0._0_8_ + -(long)buffer;
    local_d0._8_8_ = buffer;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_70,(lts_20250127 *)&local_a0,&local_50,(AlphaNum *)local_d0,in_R8);
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    std::__cxx11::string::operator=
              ((string *)&(anonymous_namespace)::temp_dir_deleter_,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    File::DeleteRecursively
              ((string *)&(anonymous_namespace)::temp_dir_deleter_,(void *)0x0,(void *)0x0);
    iVar1 = mkdir((char *)(anonymous_namespace)::temp_dir_deleter_._M_head_impl,0x1ff);
    if (iVar1 != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
                 ,0x82,"mkdir(name_.c_str(), 0777) == 0");
      piVar2 = __errno_location();
      local_50.piece_._M_len = (size_t)strerror(*piVar2);
      absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>
                ((LogMessage *)&local_a0,(char **)&local_50);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a0);
    }
    local_a0 = DAT_019a6d58;
    local_98._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(anonymous_namespace)::temp_dir_deleter_._M_head_impl;
    local_50.piece_._M_len = (size_t)&DAT_0000001c;
    local_50.piece_._M_str = "/TEMP_DIR_FOR_PROTOBUF_TESTS";
    name = DAT_019a6d58;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_d0,(lts_20250127 *)&local_a0,&local_50,DAT_019a6d58);
    contents._M_str = (char *)local_d0;
    contents._M_len = (size_t)(anon_var_dwarf_a22956 + 5);
    File::WriteStringToFileOrDie((File *)0x0,contents,(string *)name);
    if ((Nonnull<char_*>)local_d0._0_8_ != buffer) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>();
  return in_RDI;
}

Assistant:

std::string TestTempDir() { return temp_dir_deleter_.GetTempDir(); }